

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ConstraintSet::SetActuationMap
          (ConstraintSet *this,Model *model,vector<bool,_std::allocator<bool>_> *actuatedDofUpd)

{
  const_reference cVar1;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_00;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar2;
  Scalar *pSVar3;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  long in_RDI;
  uint dim;
  uint i_1;
  uint k;
  uint j;
  uint i;
  uint nu;
  uint na;
  uint nc;
  uint n;
  Index in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar6;
  uint uVar7;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(in_RDI + 0x20));
  uVar7 = 0;
  while( true ) {
    this_00 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)(ulong)uVar7;
    pDVar2 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             std::vector<bool,_std::allocator<bool>_>::size(in_RSI);
    if (pDVar2 <= this_00) break;
    std::vector<bool,_std::allocator<bool>_>::operator[]
              ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar7,in_stack_ffffffffffffffd0),
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    uVar7 = uVar7 + 1;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddb0b);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddb43);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddb71);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddb9f);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  iVar6 = 0;
  iVar5 = 0;
  for (uVar4 = 0;
      uVar4 < *(uint *)&in_RSI[1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage; uVar4 = uVar4 + 1) {
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)CONCAT44(uVar7,iVar6),
                       CONCAT44(iVar5,uVar4));
    if (cVar1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,
                          in_stack_ffffffffffffffa8,0x6ddc63);
      *pSVar3 = 1.0;
      iVar6 = iVar6 + 1;
    }
    else {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,
                          in_stack_ffffffffffffffa8,0x6ddc99);
      *pSVar3 = 1.0;
      iVar5 = iVar5 + 1;
    }
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,7199999);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddd2d);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddd5b);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddd89);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6dddb7);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero(this_00);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6dddfc);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00,
             in_stack_ffffffffffffffa8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6dde4d);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6dde6a);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6dde87);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this_00,
             in_stack_ffffffffffffffa8,0x6ddea4);
  return;
}

Assistant:

void ConstraintSet::SetActuationMap(const Model &model,
                                    const std::vector<bool> &actuatedDofUpd)
{

  assert(actuatedDofUpd.size() == model.dof_count);

  unsigned int n  = unsigned( int( model.dof_count ));
  unsigned int nc = unsigned( int( name.size() ));
  unsigned int na = 0; //actuated dofs
  unsigned int nu = 0; //unactuated dofs

  for(unsigned int i=0; i<actuatedDofUpd.size(); ++i) {
    if(actuatedDofUpd[i]) {
      ++na;
    }
  }
  nu = n-na;

  S.conservativeResize(na,model.dof_count);
  S.setZero();
  P.conservativeResize(n-na,model.dof_count);
  P.setZero();
  W.conservativeResize(na,na);
  W.setZero();
  Winv.conservativeResize(na,na);
  Winv.setZero();
  WinvSC.conservativeResize(na);
  WinvSC.setZero();

  u.resize(na);
  v.resize(nu);

  unsigned int j=0;
  unsigned int k=0;
  for(unsigned int i=0; i<model.dof_count; ++i) {
    if(actuatedDofUpd[i]) {
      S(j,i) = 1.;
      ++j;
    } else {
      P(k,i) = 1.;
      ++k;
    }
  }

  unsigned int dim = n+n+nc+na;

  //Null space method variable initialization
  dim = na+nu;
  F.conservativeResize(dim,dim);
  F.setZero();

  Ful.conservativeResize(na,na);
  Ful.setZero();
  Fur.conservativeResize(na,nu);
  Fur.setZero();
  Fll.conservativeResize(nu,na);
  Fll.setZero();
  Flr.conservativeResize(nu,nu);
  Flr.setZero();

  g.conservativeResize(n);

  Ru.conservativeResize(nc,nc);
  py.conservativeResize(nc);
  pz.conservativeResize(n-nc);

  GT.conservativeResize(n,nc);
  GTu.conservativeResize(na,nc);
  GTl.conservativeResize(nu,nc);

  GPT.conservativeResize(nc,nu);

}